

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_0::HandleTable::Resize(HandleTable *this)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  LRUHandle **ppLVar4;
  LRUHandle *pLVar5;
  LRUHandle *pLVar6;
  uint uVar7;
  LRUHandle **__s;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->elems_;
  uVar2 = 4;
  do {
    uVar7 = uVar2;
    uVar2 = uVar7 * 2;
  } while (uVar7 < uVar1);
  __s = (LRUHandle **)operator_new__((ulong)uVar7 << 3);
  uVar10 = 0;
  memset(__s,0,(ulong)uVar7 << 3);
  uVar2 = this->length_;
  if ((ulong)uVar2 != 0) {
    ppLVar4 = this->list_;
    uVar8 = 0;
    uVar10 = 0;
    do {
      pLVar6 = ppLVar4[uVar8];
      while (pLVar6 != (LRUHandle *)0x0) {
        pLVar5 = pLVar6->next_hash;
        uVar9 = pLVar6->hash & uVar7 - 1;
        pLVar6->next_hash = __s[uVar9];
        __s[uVar9] = pLVar6;
        uVar10 = uVar10 + 1;
        pLVar6 = pLVar5;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar2);
  }
  if (uVar1 != uVar10) {
    __assert_fail("elems_ == count",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/cache.cc"
                  ,0x8e,"void leveldb::(anonymous namespace)::HandleTable::Resize()");
  }
  if (this->list_ != (LRUHandle **)0x0) {
    operator_delete__(this->list_);
  }
  this->list_ = __s;
  this->length_ = uVar7;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Resize() {
    uint32_t new_length = 4;
    while (new_length < elems_) {
      new_length *= 2;
    }
    LRUHandle** new_list = new LRUHandle*[new_length];
    memset(new_list, 0, sizeof(new_list[0]) * new_length);
    uint32_t count = 0;
    for (uint32_t i = 0; i < length_; i++) {
      LRUHandle* h = list_[i];
      while (h != nullptr) {
        LRUHandle* next = h->next_hash;
        uint32_t hash = h->hash;
        LRUHandle** ptr = &new_list[hash & (new_length - 1)];
        h->next_hash = *ptr;
        *ptr = h;
        h = next;
        count++;
      }
    }
    assert(elems_ == count);
    delete[] list_;
    list_ = new_list;
    length_ = new_length;
  }